

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalDecoder::~MeshEdgebreakerTraversalDecoder
          (MeshEdgebreakerTraversalDecoder *this)

{
  unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_> *in_RDI;
  
  std::unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_>::
  ~unique_ptr(in_RDI);
  DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x16fc40);
  RAnsBitDecoder::~RAnsBitDecoder((RAnsBitDecoder *)0x16fc4e);
  DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x16fc5c);
  DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x16fc66);
  return;
}

Assistant:

MeshEdgebreakerTraversalDecoder()
      : attribute_connectivity_decoders_(nullptr),
        num_attribute_data_(0),
        decoder_impl_(nullptr) {}